

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt64x2Operation.cpp
# Opt level: O1

void Js::SIMDInt64x2Operation::OpTrunc<unsigned_long>(SIMDValue *dst,SIMDValue *src)

{
  double dVar1;
  bool bVar2;
  ulong in_RAX;
  ulong uVar3;
  
  dVar1 = (src->field_0).f64[0];
  if (0.0 < dVar1) {
    if (1.8446744073709552e+19 <= dVar1) {
      in_RAX = 0xffffffffffffffff;
      goto LAB_00b0c679;
    }
    bVar2 = true;
  }
  else {
    in_RAX = 0;
LAB_00b0c679:
    bVar2 = false;
  }
  uVar3 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
  if (!bVar2) {
    uVar3 = in_RAX;
  }
  (dst->field_0).i64[0] = uVar3;
  dVar1 = (src->field_0).f64[1];
  if (0.0 < dVar1) {
    bVar2 = true;
    if (dVar1 < 1.8446744073709552e+19) goto LAB_00b0c6c7;
    in_RAX = 0xffffffffffffffff;
  }
  else {
    in_RAX = 0;
  }
  bVar2 = false;
LAB_00b0c6c7:
  uVar3 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
  if (!bVar2) {
    uVar3 = in_RAX;
  }
  (dst->field_0).i64[1] = uVar3;
  return;
}

Assistant:

void SIMDInt64x2Operation::OpTrunc(SIMDValue* dst, SIMDValue* src)
    {
        T convertedVal;
        dst->i64[0] = IsInRange(src->f64[0], convertedVal) ? (T)src->f64[0] : convertedVal;
        dst->i64[1] = IsInRange(src->f64[1], convertedVal) ? (T)src->f64[1] : convertedVal;
    }